

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

void __thiscall
Analyser_addSameExternalVariable_Test::Analyser_addSameExternalVariable_Test
          (Analyser_addSameExternalVariable_Test *this)

{
  Analyser_addSameExternalVariable_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Analyser_addSameExternalVariable_Test_0017e1c8;
  return;
}

Assistant:

TEST(Analyser, addSameExternalVariable)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto analyser = libcellml::Analyser::create();
    auto externalVariable = libcellml::AnalyserExternalVariable::create(model->component("membrane")->variable("V"));

    analyser->addExternalVariable(externalVariable);

    EXPECT_EQ(size_t(1), analyser->externalVariableCount());

    analyser->addExternalVariable(externalVariable);

    EXPECT_EQ(size_t(1), analyser->externalVariableCount());
}